

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::captureBlockTokens(HlslGrammar *this,TVector<glslang::HlslToken> *tokens)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  int iVar3;
  
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  iVar3 = 0;
  if (bVar1) {
    do {
      EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
      if (EVar2 == EHTokLeftBrace) {
        iVar3 = iVar3 + 1;
      }
      else if (EVar2 == EHTokRightBrace) {
        iVar3 = iVar3 + -1;
      }
      else if (EVar2 == EHTokNone) {
        iVar3 = 0;
        goto LAB_003aa82f;
      }
      std::vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>::push_back
                (&tokens->
                  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>,
                 &(this->super_HlslTokenStream).token);
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    } while (0 < iVar3);
    iVar3 = 1;
  }
LAB_003aa82f:
  return SUB41(iVar3,0);
}

Assistant:

bool HlslGrammar::captureBlockTokens(TVector<HlslToken>& tokens)
{
    if (! peekTokenClass(EHTokLeftBrace))
        return false;

    int braceCount = 0;

    do {
        switch (peek()) {
        case EHTokLeftBrace:
            ++braceCount;
            break;
        case EHTokRightBrace:
            --braceCount;
            break;
        case EHTokNone:
            // End of input before balance { } is bad...
            return false;
        default:
            break;
        }

        tokens.push_back(token);
        advanceToken();
    } while (braceCount > 0);

    return true;
}